

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall
kratos::VarConcat::replace_var
          (VarConcat *this,shared_ptr<kratos::Var> *target,shared_ptr<kratos::Var> *item)

{
  bool bVar1;
  element_type *peVar2;
  reference ppVVar3;
  __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
  local_48;
  element_type *local_40;
  __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
  local_38;
  __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
  local_30;
  __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
  local_28;
  __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_> pos
  ;
  shared_ptr<kratos::Var> *item_local;
  shared_ptr<kratos::Var> *target_local;
  VarConcat *this_local;
  
  pos._M_current = (Var **)item;
  local_30._M_current =
       (Var **)std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::begin(&this->vars_);
  local_38._M_current =
       (Var **)std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::end(&this->vars_);
  local_40 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                       (&target->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<kratos::Var**,std::vector<kratos::Var*,std::allocator<kratos::Var*>>>,kratos::Var*>
                       (local_30,local_38,&local_40);
  local_48._M_current =
       (Var **)std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::end(&this->vars_);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_48);
  if (bVar1) {
    peVar2 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)pos._M_current);
    ppVVar3 = __gnu_cxx::
              __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
              ::operator*(&local_28);
    *ppVVar3 = peVar2;
  }
  return;
}

Assistant:

void VarConcat::replace_var(const std::shared_ptr<Var> &target, const std::shared_ptr<Var> &item) {
    auto pos = std::find(vars_.begin(), vars_.end(), target.get());
    if (pos != vars_.end()) {
        *pos = item.get();
    }
}